

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::initTest
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_> *this_00;
  pointer pSVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  pointer pSVar5;
  iterator iVar6;
  char *msg;
  GLuint *pGVar7;
  StorageConfig local_a8;
  StorageConfig local_88;
  StorageConfig local_68;
  StorageConfig local_48;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pSVar5 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar5) {
    (this->m_non_filterable_texture_configs).
    super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  this_00 = &this->m_non_filterable_texture_configs;
  (**(code **)(lVar4 + 0xff0))(0xd05,1);
  (**(code **)(lVar4 + 0xff0))(0xcf5,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                  ,0x226);
  local_48.m_width = 0x40;
  local_48.m_depth = 0x12;
  local_48.m_height = 0x40;
  local_48.m_levels = 7;
  local_48.m_to_id = 0;
  local_68.m_width = 0x75;
  local_68.m_depth = 6;
  local_68.m_height = 0x75;
  local_68.m_levels = 7;
  local_68.m_to_id = 0;
  local_88.m_width = 0x100;
  local_88.m_depth = 6;
  local_88.m_height = 0x100;
  local_88.m_levels = 9;
  local_88.m_to_id = 0;
  local_a8.m_width = 0xad;
  local_a8.m_depth = 0xc;
  local_a8.m_height = 0xad;
  local_a8.m_levels = 8;
  local_a8.m_to_id = 0;
  iVar6._M_current =
       (this->m_non_filterable_texture_configs).
       super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar6,
               &local_48);
    iVar6._M_current =
         (this->m_non_filterable_texture_configs).
         super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar6._M_current)->m_width = 0x40;
    (iVar6._M_current)->m_depth = 0x12;
    (iVar6._M_current)->m_height = 0x40;
    (iVar6._M_current)->m_levels = 7;
    (iVar6._M_current)->m_to_id = 0;
    iVar6._M_current =
         (this->m_non_filterable_texture_configs).
         super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->m_non_filterable_texture_configs).
    super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  if (iVar6._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar6,
               &local_68);
    iVar6._M_current =
         (this->m_non_filterable_texture_configs).
         super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar6._M_current)->m_width = local_68.m_width;
    (iVar6._M_current)->m_depth = local_68.m_depth;
    (iVar6._M_current)->m_height = local_68.m_height;
    (iVar6._M_current)->m_levels = local_68.m_levels;
    (iVar6._M_current)->m_to_id = local_68.m_to_id;
    iVar6._M_current =
         (this->m_non_filterable_texture_configs).
         super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->m_non_filterable_texture_configs).
    super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  if (iVar6._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar6,
               &local_88);
    iVar6._M_current =
         (this->m_non_filterable_texture_configs).
         super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar6._M_current)->m_width = local_88.m_width;
    (iVar6._M_current)->m_depth = local_88.m_depth;
    (iVar6._M_current)->m_height = local_88.m_height;
    (iVar6._M_current)->m_levels = local_88.m_levels;
    (iVar6._M_current)->m_to_id = local_88.m_to_id;
    iVar6._M_current =
         (this->m_non_filterable_texture_configs).
         super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->m_non_filterable_texture_configs).
    super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  if (iVar6._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar6,
               &local_a8);
    pSVar5 = (this->m_non_filterable_texture_configs).
             super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl
             .super__Vector_impl_data._M_finish;
  }
  else {
    (iVar6._M_current)->m_width = local_a8.m_width;
    (iVar6._M_current)->m_depth = local_a8.m_depth;
    (iVar6._M_current)->m_height = local_a8.m_height;
    (iVar6._M_current)->m_levels = local_a8.m_levels;
    (iVar6._M_current)->m_to_id = local_a8.m_to_id;
    pSVar5 = (this->m_non_filterable_texture_configs).
             super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
    (this->m_non_filterable_texture_configs).
    super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  pSVar1 = (this_00->super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != pSVar5) {
    pGVar7 = &pSVar1->m_to_id;
    do {
      (**(code **)(lVar4 + 0x6f8))(1,pGVar7);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x262);
      (**(code **)(lVar4 + 0xb8))(0x9009,*pGVar7);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x265);
      (**(code **)(lVar4 + 0x1360))(0x9009,0x2800,0x2601);
      (**(code **)(lVar4 + 0x1360))(0x9009,0x2801,0x2601);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glTexParameteri() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x269);
      if (this->m_storage_type == ST_MUTABLE) {
        (**(code **)(lVar4 + 0x1320))
                  (0x9009,0,0x8d82,pGVar7[1],pGVar7[-2],((StorageConfig *)(pGVar7 + -3))->m_depth,0,
                   0x8d99,0x1404,0);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        msg = "glTexImage3D() call failed.";
        iVar2 = 0x272;
      }
      else {
        (**(code **)(lVar4 + 0x1398))
                  (0x9009,pGVar7[-1],0x8d82,pGVar7[1],pGVar7[-2],
                   ((StorageConfig *)(pGVar7 + -3))->m_depth);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        msg = "glTexStorage3D() call failed.";
        iVar2 = 0x279;
      }
      glu::checkError(dVar3,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,iVar2);
      pSVar5 = (pointer)(pGVar7 + 2);
      pGVar7 = pGVar7 + 5;
    } while (pSVar5 != (this->m_non_filterable_texture_configs).
                       super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapNonFilterable::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure no configs are already in place */
	m_non_filterable_texture_configs.clear();

	/* Update pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call(s) failed");

	/* Define a number of storage configurations, all using GL_RGBA32I
	 * internalformat:
	 *
	 *    [width x height x depth]
	 * 1)   64   x   64   x  18;
	 * 2)  117   x  117   x   6;
	 * 3)  256   x  256   x   6;
	 * 4)  173   x  173   x  12;
	 */

	/* Size 64 x 64 x 18 */
	StorageConfig storage_config1;

	storage_config1.m_width  = 64;
	storage_config1.m_height = 64;
	storage_config1.m_depth  = 18;
	storage_config1.m_to_id  = 0;
	storage_config1.m_levels = getAmountOfLevelsForTexture(storage_config1.m_width, storage_config1.m_height);

	/* Size 117 x 117 x 6 */
	StorageConfig storage_config2;

	storage_config2.m_width  = 117;
	storage_config2.m_height = 117;
	storage_config2.m_depth  = 6;
	storage_config2.m_to_id  = 0;
	storage_config2.m_levels = getAmountOfLevelsForTexture(storage_config2.m_width, storage_config2.m_height);

	/* Size 256 x 256 x 6 */
	StorageConfig storage_config3;

	storage_config3.m_width  = 256;
	storage_config3.m_height = 256;
	storage_config3.m_depth  = 6;
	storage_config3.m_to_id  = 0;
	storage_config3.m_levels = getAmountOfLevelsForTexture(storage_config3.m_width, storage_config3.m_height);

	/* Size 173 x 173 x 12 */
	StorageConfig storage_config4;

	storage_config4.m_width  = 173;
	storage_config4.m_height = 173;
	storage_config4.m_depth  = 12;
	storage_config4.m_to_id  = 0;
	storage_config4.m_levels = getAmountOfLevelsForTexture(storage_config4.m_width, storage_config4.m_height);

	m_non_filterable_texture_configs.push_back(storage_config1);
	m_non_filterable_texture_configs.push_back(storage_config2);
	m_non_filterable_texture_configs.push_back(storage_config3);
	m_non_filterable_texture_configs.push_back(storage_config4);

	/* Generate and configure a texture object for each storage config. */
	for (std::vector<StorageConfig>::iterator storage_config_iterator = m_non_filterable_texture_configs.begin();
		 storage_config_iterator != m_non_filterable_texture_configs.end(); storage_config_iterator++)
	{
		StorageConfig& storage_config = *storage_config_iterator;

		gl.genTextures(1, &storage_config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, storage_config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call(s) failed.");

		/* Initialize texture storage. */
		if (m_storage_type == ST_MUTABLE)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, /* level */
						  GL_RGBA32I, storage_config.m_width, storage_config.m_height, storage_config.m_depth, 0,
						  GL_RGBA_INTEGER, GL_INT, 0); /* data */

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D() call failed.");
		}
		else
		{
			gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, storage_config.m_levels, GL_RGBA32I, storage_config.m_width,
							storage_config.m_height, storage_config.m_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");
		}
	} /* for (all storage configs) */
}